

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<false> * __thiscall
ArrayState<false>::Float(ArrayState<false> *this,Context<false> *ctx,float f)

{
  size_t *psVar1;
  pointer pNVar2;
  
  if ((f != 0.0) || (NAN(f))) {
    pNVar2 = (ctx->namespace_path).
             super__Vector_base<Namespace<false>,_std::allocator<Namespace<false>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    features::push_back(pNVar2[-1].ftrs,f,this->array_hash);
    psVar1 = &pNVar2[-1].feature_count;
    *psVar1 = *psVar1 + 1;
  }
  this->array_hash = this->array_hash + 1;
  return &this->super_BaseState<false>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    if (audit)
    {
      stringstream str;
      str << '[' << (array_hash - ctx.CurrentNamespace().namespace_hash) << ']';

      ctx.CurrentNamespace().AddFeature(f, array_hash, str.str().c_str());
    }
    else
      ctx.CurrentNamespace().AddFeature(f, array_hash, nullptr);
    array_hash++;

    return this;
  }